

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O3

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnImportTable
          (BinaryReaderInterp *this,Index import_index,string_view module_name,
          string_view field_name,Index table_index,Type elem_type,Limits *elem_limits)

{
  ModuleDesc *pMVar1;
  Result RVar2;
  Enum EVar3;
  pointer *__ptr;
  Location loc;
  undefined1 local_f8 [16];
  undefined1 local_e8 [32];
  uint64_t uStack_c8;
  bool local_c0;
  undefined4 uStack_bf;
  undefined3 uStack_bb;
  long *local_b8;
  long local_b0;
  long local_a8 [2];
  long *local_98;
  long local_90;
  long local_88 [2];
  Location local_78;
  long *local_58 [2];
  long local_48 [2];
  _func_int **local_38;
  
  local_f8._8_8_ = field_name._M_str;
  local_78.field_1.field_0.last_column = 0;
  local_78.filename._M_len = (this->filename_)._M_len;
  local_78.filename._M_str = (this->filename_)._M_str;
  local_78.field_1.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
       ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  RVar2 = SharedValidator::OnTable(&this->validator_,&local_78,elem_type,elem_limits);
  EVar3 = Error;
  if (RVar2.enum_ != Error) {
    local_e8._24_4_ = *(undefined4 *)&elem_limits->initial;
    local_e8._28_4_ = *(undefined4 *)((long)&elem_limits->initial + 4);
    uStack_c8 = elem_limits->max;
    local_c0 = elem_limits->has_max;
    local_e8._8_4_ = Table;
    local_e8._0_8_ = &PTR__ExternType_00184100;
    local_e8._12_8_ = elem_type;
    uStack_bf._0_1_ = elem_limits->is_shared;
    uStack_bf._1_1_ = elem_limits->is_64;
    uStack_bf._2_2_ = *(undefined2 *)&elem_limits->field_0x13;
    uStack_bb = (undefined3)((uint)*(undefined4 *)&elem_limits->field_0x14 >> 8);
    if ((local_c0 & 1U) == 0) {
      uStack_c8 = 0xffffffff;
    }
    pMVar1 = this->module_;
    local_98 = local_88;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_98,module_name._M_str,module_name._M_str + module_name._M_len);
    local_b8 = local_a8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b8,local_f8._8_8_,(char *)(local_f8._8_8_ + field_name._M_len));
    TableType::Clone((TableType *)local_f8);
    local_78.filename._M_len = (size_t)&local_78.field_1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_78,local_98,local_90 + (long)local_98);
    local_58[0] = local_48;
    std::__cxx11::string::_M_construct<char*>((string *)local_58,local_b8,local_b0 + (long)local_b8)
    ;
    local_38 = (_func_int **)local_f8._0_8_;
    local_f8._0_8_ = (_func_int **)0x0;
    std::vector<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>::
    emplace_back<wabt::interp::ImportDesc>(&pMVar1->imports,(ImportDesc *)&local_78);
    if (local_38 != (_func_int **)0x0) {
      (**(code **)(*local_38 + 8))();
    }
    local_38 = (_func_int **)0x0;
    if (local_58[0] != local_48) {
      operator_delete(local_58[0],local_48[0] + 1);
    }
    if ((anon_union_16_2_ecfd7102_for_Location_1 *)local_78.filename._M_len != &local_78.field_1) {
      operator_delete((void *)local_78.filename._M_len,(long)local_78.field_1.field_1.offset + 1);
    }
    if ((_func_int **)local_f8._0_8_ != (_func_int **)0x0) {
      (**(code **)(*(_func_int **)local_f8._0_8_ + 8))();
    }
    local_f8._0_8_ = (_func_int **)0x0;
    if (local_b8 != local_a8) {
      operator_delete(local_b8,local_a8[0] + 1);
    }
    if (local_98 != local_88) {
      operator_delete(local_98,local_88[0] + 1);
    }
    std::vector<wabt::interp::TableType,_std::allocator<wabt::interp::TableType>_>::push_back
              (&this->table_types_,(value_type *)local_e8);
    EVar3 = Ok;
  }
  return (Result)EVar3;
}

Assistant:

Result BinaryReaderInterp::OnImportTable(Index import_index,
                                         std::string_view module_name,
                                         std::string_view field_name,
                                         Index table_index,
                                         Type elem_type,
                                         const Limits* elem_limits) {
  CHECK_RESULT(validator_.OnTable(GetLocation(), elem_type, *elem_limits));
  TableType table_type{elem_type, *elem_limits};
  module_.imports.push_back(ImportDesc{ImportType(
      std::string(module_name), std::string(field_name), table_type.Clone())});
  table_types_.push_back(table_type);
  return Result::Ok;
}